

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
PrimitiveTestClass::PrintArr<unsigned_long_long*>(PrimitiveTestClass *this,unsigned_long_long *arr)

{
  ostream *poVar1;
  ulong local_20;
  size_t i;
  unsigned_long_long *arr_local;
  PrimitiveTestClass *this_local;
  
  for (local_20 = 0; local_20 < (ulong)(long)this->SIZE; local_20 = local_20 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[local_20]);
    std::operator<<(poVar1,", ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintArr(T arr)
        {
            for (size_t i = 0; i < SIZE; i++)
            {
                cout << arr[i] << ", ";
            }
            
            cout << endl;
        }